

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

void __thiscall QFormLayout::insertRow(QFormLayout *this,int row,QWidget *label,QLayout *field)

{
  QFormLayoutPrivate *this_00;
  bool bVar1;
  uint uVar2;
  long in_FS_OFFSET;
  QFormLayoutItem *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFormLayoutPrivate **)&(this->super_QLayout).field_0x8;
  if (label != (QWidget *)0x0) {
    bVar1 = QLayoutPrivate::checkWidget(&this_00->super_QLayoutPrivate,label);
    if (!bVar1) goto LAB_003a15d8;
  }
  if (field != (QLayout *)0x0) {
    bVar1 = QLayoutPrivate::checkLayout(&this_00->super_QLayoutPrivate,field);
    if (!bVar1) goto LAB_003a15d8;
  }
  uVar2 = (uint)((ulong)(this_00->m_matrix).m_storage.d.size >> 1);
  if (uVar2 < (uint)row) {
    row = uVar2;
  }
  local_38 = (QFormLayoutItem *)0x0;
  QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::insertRow(&this_00->m_matrix,row,&local_38);
  if (label != (QWidget *)0x0) {
    QFormLayoutPrivate::setWidget(this_00,row,LabelRole,label);
  }
  if (field != (QLayout *)0x0) {
    QFormLayoutPrivate::setLayout(this_00,row,FieldRole,field);
  }
  (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
LAB_003a15d8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFormLayout::insertRow(int row, QWidget *label, QLayout *field)
{
    Q_D(QFormLayout);
    if ((label && !d->checkWidget(label)) || (field && !d->checkLayout(field)))
        return;

    row = d->insertRow(row);
    if (label)
        d->setWidget(row, LabelRole, label);
    if (field)
        d->setLayout(row, FieldRole, field);
    invalidate();
}